

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

void free_all_body_data_items(MESSAGE_HANDLE message)

{
  ulong local_18;
  size_t i;
  MESSAGE_HANDLE message_local;
  
  for (local_18 = 0; local_18 < message->body_amqp_data_count; local_18 = local_18 + 1) {
    if (message->body_amqp_data_items[local_18].body_data_section_bytes != (uchar *)0x0) {
      free(message->body_amqp_data_items[local_18].body_data_section_bytes);
      message->body_amqp_data_items[local_18].body_data_section_bytes = (uchar *)0x0;
    }
  }
  if (message->body_amqp_data_items != (BODY_AMQP_DATA *)0x0) {
    free(message->body_amqp_data_items);
  }
  message->body_amqp_data_count = 0;
  message->body_amqp_data_items = (BODY_AMQP_DATA *)0x0;
  return;
}

Assistant:

static void free_all_body_data_items(MESSAGE_HANDLE message)
{
    size_t i;

    for (i = 0; i < message->body_amqp_data_count; i++)
    {
        if (message->body_amqp_data_items[i].body_data_section_bytes != NULL)
        {
            free(message->body_amqp_data_items[i].body_data_section_bytes);
            message->body_amqp_data_items[i].body_data_section_bytes = NULL;
        }
    }

    if (message->body_amqp_data_items != NULL)
    {
        free(message->body_amqp_data_items);
    }
    message->body_amqp_data_count = 0;
    message->body_amqp_data_items = NULL;
}